

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t uVar1;
  int iVar2;
  const_reference this;
  uint8_t *puVar3;
  UnknownFieldSet *unknown_fields_00;
  uint64_t uVar4;
  size_t __n;
  int i;
  int index;
  uint32_t uVar5;
  uint uVar6;
  string_view s;
  
  index = 0;
  do {
    iVar2 = RepeatedField<google::protobuf::UnknownField>::size(&unknown_fields->fields_);
    if (iVar2 <= index) {
      return target;
    }
    this = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,index);
    target = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    switch(this->type_) {
    case 0:
      uVar1 = this->number_;
      uVar4 = UnknownField::varint(this);
      target = WireFormatLite::WriteUInt64ToArray(uVar1,uVar4,target);
      break;
    case 1:
      uVar1 = this->number_;
      uVar5 = UnknownField::fixed32(this);
      target = WireFormatLite::WriteFixed32ToArray(uVar1,uVar5,target);
      break;
    case 2:
      uVar1 = this->number_;
      uVar4 = UnknownField::fixed64(this);
      target = WireFormatLite::WriteFixed64ToArray(uVar1,uVar4,target);
      break;
    case 3:
      uVar1 = this->number_;
      s = UnknownField::length_delimited(this);
      __n = s._M_len;
      if ((long)__n < 0x80) {
        puVar3 = stream->end_;
        uVar5 = uVar1 * 8;
        iVar2 = io::EpsCopyOutputStream::TagSize(uVar5);
        if ((long)__n <= (long)(puVar3 + ~(ulong)(target + iVar2) + 0x10)) {
          puVar3 = target + 2;
          for (uVar6 = uVar5 | 2; 0x7f < uVar6; uVar6 = uVar6 >> 7) {
            puVar3[-2] = (byte)uVar6 | 0x80;
            puVar3 = puVar3 + 1;
          }
          puVar3[-2] = (byte)uVar6;
          puVar3[-1] = (uint8_t)s._M_len;
          memcpy(puVar3,s._M_str,__n);
          target = puVar3 + __n;
          break;
        }
      }
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,uVar1,s,target);
      break;
    case 4:
      puVar3 = WireFormatLite::WriteTagToArray(this->number_,WIRETYPE_START_GROUP,target);
      unknown_fields_00 = UnknownField::group(this);
      puVar3 = InternalSerializeUnknownFieldsToArray(unknown_fields_00,puVar3,stream);
      puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar3);
      target = WireFormatLite::WriteTagToArray(this->number_,WIRETYPE_END_GROUP,puVar3);
    }
    index = index + 1;
  } while( true );
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    target = stream->EnsureSpace(target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        target = stream->EnsureSpace(target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}